

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::empty_builder_movector_test(void)

{
  GrpcLikeMessageBuilder dst;
  GrpcLikeMessageBuilder src;
  
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&src);
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&dst,&src);
  TestEq<unsigned_long,int>
            ((ulong)src.super_FlatBufferBuilder.buf_.size_,0,"\'src_size\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x57,
             "static void BuilderTests<GrpcLikeMessageBuilder>::empty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  TestEq<unsigned_long,unsigned_long>
            ((ulong)src.super_FlatBufferBuilder.buf_.size_,
             (ulong)dst.super_FlatBufferBuilder.buf_.size_,"\'src_size\' != \'dst_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x58,
             "static void BuilderTests<GrpcLikeMessageBuilder>::empty_builder_movector_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src.super_FlatBufferBuilder);
  return;
}

Assistant:

static void empty_builder_movector_test() {
    SrcBuilder src;
    size_t src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    size_t dst_size = dst.GetSize();
    TEST_EQ_FUNC(src_size, 0);
    TEST_EQ_FUNC(src_size, dst_size);
  }